

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Serializer.cpp
# Opt level: O3

void __thiscall
adios2::format::BP4Serializer::MakeHeader
          (BP4Serializer *this,BufferSTL *b,string *fileType,bool isActive)

{
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer pcVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  ulong __val;
  pointer pcVar7;
  size_type sVar8;
  size_type sVar9;
  char cVar10;
  bool bVar11;
  char *src;
  long *plVar12;
  undefined8 *puVar13;
  size_t sVar14;
  undefined7 in_register_00000009;
  ulong *puVar15;
  ulong uVar16;
  size_t sVar17;
  size_type *psVar18;
  char cVar19;
  undefined8 uVar20;
  string fileTypeStr;
  string __str;
  string versionLongTag;
  string patchVersion;
  string minorVersion;
  string majorVersion;
  string local_1d8;
  string local_1b8;
  string local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string local_158;
  string local_138;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined4 local_d4;
  string local_d0;
  char *local_b0 [2];
  char local_a0 [16];
  char *local_90 [2];
  char local_80 [16];
  char *local_70 [2];
  char local_60 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_d4 = (undefined4)CONCAT71(in_register_00000009,isActive);
  if ((b->super_Buffer).m_Position == 0) goto LAB_0056f94f;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Toolkit","");
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_118,"format::bp::BP4Serializer","");
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"MakeHeader","");
  std::operator+(&local_178,"can only be called for an empty buffer. This one for ",fileType);
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_178);
  paVar2 = &local_1d8.field_2;
  puVar15 = (ulong *)(plVar12 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar12 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar15) {
    local_1d8.field_2._M_allocated_capacity = *puVar15;
    local_1d8.field_2._8_8_ = plVar12[3];
    local_1d8._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_1d8.field_2._M_allocated_capacity = *puVar15;
    local_1d8._M_dataplus._M_p = (pointer)*plVar12;
  }
  local_1d8._M_string_length = plVar12[1];
  *plVar12 = (long)puVar15;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  __val = (b->super_Buffer).m_Position;
  cVar19 = '\x01';
  if (9 < __val) {
    uVar16 = __val;
    cVar10 = '\x04';
    do {
      cVar19 = cVar10;
      if (uVar16 < 100) {
        cVar19 = cVar19 + -2;
        goto LAB_0056f764;
      }
      if (uVar16 < 1000) {
        cVar19 = cVar19 + -1;
        goto LAB_0056f764;
      }
      if (uVar16 < 10000) goto LAB_0056f764;
      bVar11 = 99999 < uVar16;
      uVar16 = uVar16 / 10000;
      cVar10 = cVar19 + '\x04';
    } while (bVar11);
    cVar19 = cVar19 + '\x01';
  }
LAB_0056f764:
  paVar3 = &local_198.field_2;
  local_198._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct((ulong)&local_198,cVar19);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_198._M_dataplus._M_p,(uint)local_198._M_string_length,__val);
  uVar20 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar2) {
    uVar20 = local_1d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar20 < local_198._M_string_length + local_1d8._M_string_length) {
    uVar20 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != paVar3) {
      uVar20 = local_198.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar20 < local_198._M_string_length + local_1d8._M_string_length) goto LAB_0056f7cb;
    puVar13 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_198,0,(char *)0x0,(ulong)local_1d8._M_dataplus._M_p);
  }
  else {
LAB_0056f7cb:
    puVar13 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_198._M_dataplus._M_p);
  }
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  psVar18 = puVar13 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar13 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar18) {
    local_1b8.field_2._M_allocated_capacity = *psVar18;
    local_1b8.field_2._8_8_ = puVar13[3];
  }
  else {
    local_1b8.field_2._M_allocated_capacity = *psVar18;
    local_1b8._M_dataplus._M_p = (pointer)*puVar13;
  }
  local_1b8._M_string_length = puVar13[1];
  *puVar13 = psVar18;
  puVar13[1] = 0;
  *(undefined1 *)psVar18 = 0;
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_1b8);
  psVar18 = (size_type *)(plVar12 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar12 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar18) {
    local_158.field_2._M_allocated_capacity = *psVar18;
    local_158.field_2._8_8_ = plVar12[3];
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  }
  else {
    local_158.field_2._M_allocated_capacity = *psVar18;
    local_158._M_dataplus._M_p = (pointer)*plVar12;
  }
  local_158._M_string_length = plVar12[1];
  *plVar12 = (long)psVar18;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  helper::Throw<std::invalid_argument>(&local_d0,&local_118,&local_138,&local_158,-1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != paVar3) {
    operator_delete(local_198._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
LAB_0056f94f:
  sVar14 = BufferSTL::GetAvailableSize(b);
  if (sVar14 < 0x40) {
    sVar14 = (b->super_Buffer).m_Position;
    std::operator+(&local_50,"BP4Serializer::MakeHeader ",fileType);
    BufferSTL::Resize(b,sVar14 + 0x40,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_d0,'\x01');
  *local_d0._M_dataplus._M_p = '2';
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_118,'\x01');
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_138,'\x01');
  *local_138._M_dataplus._M_p = '0';
  if ((b->super_Buffer).m_Position != 0) {
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"Toolkit","");
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b8,"format::bp::BP4Serializer","");
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"MakeHeader","");
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_178,"Version Tag position mismatch","");
    helper::Throw<std::runtime_error>(&local_158,&local_1b8,&local_1d8,&local_178,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p);
    }
  }
  std::operator+(&local_f8,"ADIOS-BP v",&local_d0);
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_f8);
  paVar2 = &local_198.field_2;
  psVar18 = (size_type *)(plVar12 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar12 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar18) {
    local_198.field_2._M_allocated_capacity = *psVar18;
    local_198.field_2._8_8_ = plVar12[3];
    local_198._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_198.field_2._M_allocated_capacity = *psVar18;
    local_198._M_dataplus._M_p = (pointer)*plVar12;
  }
  local_198._M_string_length = plVar12[1];
  *plVar12 = (long)psVar18;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  plVar12 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_198,(ulong)local_118._M_dataplus._M_p);
  paVar3 = &local_178.field_2;
  psVar18 = (size_type *)(plVar12 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar12 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar18) {
    local_178.field_2._M_allocated_capacity = *psVar18;
    local_178.field_2._8_8_ = plVar12[3];
    local_178._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_178.field_2._M_allocated_capacity = *psVar18;
    local_178._M_dataplus._M_p = (pointer)*plVar12;
  }
  local_178._M_string_length = plVar12[1];
  *plVar12 = (long)psVar18;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_178);
  paVar4 = &local_1d8.field_2;
  psVar18 = (size_type *)(plVar12 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar12 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar18) {
    local_1d8.field_2._M_allocated_capacity = *psVar18;
    local_1d8.field_2._8_8_ = plVar12[3];
    local_1d8._M_dataplus._M_p = (pointer)paVar4;
  }
  else {
    local_1d8.field_2._M_allocated_capacity = *psVar18;
    local_1d8._M_dataplus._M_p = (pointer)*plVar12;
  }
  local_1d8._M_string_length = plVar12[1];
  *plVar12 = (long)psVar18;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  plVar12 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_1d8,(ulong)local_138._M_dataplus._M_p);
  psVar18 = (size_type *)(plVar12 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar12 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar18) {
    local_1b8.field_2._M_allocated_capacity = *psVar18;
    local_1b8.field_2._8_8_ = plVar12[3];
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  }
  else {
    local_1b8.field_2._M_allocated_capacity = *psVar18;
    local_1b8._M_dataplus._M_p = (pointer)*plVar12;
  }
  local_1b8._M_string_length = plVar12[1];
  *plVar12 = (long)psVar18;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_1b8);
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  psVar18 = (size_type *)(plVar12 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar12 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar18) {
    local_158.field_2._M_allocated_capacity = *psVar18;
    local_158.field_2._8_8_ = plVar12[3];
  }
  else {
    local_158.field_2._M_allocated_capacity = *psVar18;
    local_158._M_dataplus._M_p = (pointer)*plVar12;
  }
  local_158._M_string_length = plVar12[1];
  *plVar12 = (long)psVar18;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar4) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != paVar3) {
    operator_delete(local_178._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != paVar2) {
    operator_delete(local_198._M_dataplus._M_p);
  }
  paVar6 = &local_f8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar6) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  std::__cxx11::string::substr((ulong)&local_1b8,(ulong)fileType);
  std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_1b8._M_dataplus._M_p);
  if (local_158._M_string_length < 0x20) {
    if (local_158._M_string_length != 0) {
      memmove((b->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start + (b->super_Buffer).m_Position,
              local_158._M_dataplus._M_p,local_158._M_string_length);
    }
  }
  else {
    sVar14 = (b->super_Buffer).m_Position;
    pcVar7 = (b->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar8 = *(size_type *)local_158._M_dataplus._M_p;
    sVar9 = *(size_type *)(local_158._M_dataplus._M_p + 8);
    uVar20 = *(undefined8 *)(local_158._M_dataplus._M_p + 0x18);
    pcVar5 = pcVar7 + sVar14 + 0x10;
    *(undefined8 *)pcVar5 = *(undefined8 *)(local_158._M_dataplus._M_p + 0x10);
    *(undefined8 *)(pcVar5 + 8) = uVar20;
    psVar18 = (size_type *)(pcVar7 + sVar14);
    *psVar18 = sVar8;
    psVar18[1] = sVar9;
  }
  psVar1 = &(b->super_Buffer).m_Position;
  *psVar1 = *psVar1 + 0x20;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,local_d0._M_dataplus._M_p,
             local_d0._M_dataplus._M_p + local_d0._M_string_length);
  (b->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start[(b->super_Buffer).m_Position] = *local_70[0];
  psVar1 = &(b->super_Buffer).m_Position;
  *psVar1 = *psVar1 + 1;
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_90,local_118._M_dataplus._M_p,
             local_118._M_dataplus._M_p + local_118._M_string_length);
  (b->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start[(b->super_Buffer).m_Position] = *local_90[0];
  psVar1 = &(b->super_Buffer).m_Position;
  *psVar1 = *psVar1 + 1;
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b0,local_138._M_dataplus._M_p,
             local_138._M_dataplus._M_p + local_138._M_string_length);
  (b->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start[(b->super_Buffer).m_Position] = *local_b0[0];
  sVar14 = (b->super_Buffer).m_Position + 1;
  (b->super_Buffer).m_Position = sVar14;
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0]);
    sVar14 = (b->super_Buffer).m_Position;
  }
  (b->super_Buffer).m_Position = sVar14 + 1;
  if (sVar14 + 1 != 0x24) {
    local_1d8._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"Toolkit","");
    local_178._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_178,"format::bp::BP4Serializer","");
    local_198._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"MakeHeader","");
    local_f8._M_dataplus._M_p = (pointer)paVar6;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"Endian Flag position mismatch","");
    helper::Throw<std::runtime_error>(&local_1d8,&local_178,&local_198,&local_f8,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar6) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != paVar2) {
      operator_delete(local_198._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != paVar3) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != paVar4) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
  }
  bVar11 = helper::IsLittleEndian();
  (b->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start[(b->super_Buffer).m_Position] = !bVar11;
  sVar17 = (b->super_Buffer).m_Position + 1;
  (b->super_Buffer).m_Position = sVar17;
  sVar14 = 0x25;
  if (sVar17 != 0x25) {
    local_1d8._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"Toolkit","");
    local_178._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_178,"format::bp::BP4Serializer","");
    local_198._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"MakeHeader","");
    local_f8._M_dataplus._M_p = (pointer)paVar6;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"Active Flag position mismatch","");
    helper::Throw<std::runtime_error>(&local_1d8,&local_178,&local_198,&local_f8,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar6) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != paVar2) {
      operator_delete(local_198._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != paVar3) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != paVar4) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    sVar14 = (b->super_Buffer).m_Position;
  }
  (b->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start[sVar14] = '\x04';
  sVar17 = (b->super_Buffer).m_Position + 1;
  (b->super_Buffer).m_Position = sVar17;
  sVar14 = 0x26;
  if (sVar17 != 0x26) {
    local_1d8._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"Toolkit","");
    local_178._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_178,"format::bp::BP4Serializer","");
    local_198._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"MakeHeader","");
    local_f8._M_dataplus._M_p = (pointer)paVar6;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"Active Flag position mismatch","");
    helper::Throw<std::runtime_error>(&local_1d8,&local_178,&local_198,&local_f8,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar6) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != paVar2) {
      operator_delete(local_198._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != paVar3) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != paVar4) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    sVar14 = (b->super_Buffer).m_Position;
  }
  (b->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start[sVar14] = (char)local_d4;
  sVar14 = (b->super_Buffer).m_Position + 0x1a;
  (b->super_Buffer).m_Position = sVar14;
  (b->super_Buffer).m_AbsolutePosition = sVar14;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void BP4Serializer::MakeHeader(BufferSTL &b, const std::string fileType, const bool isActive)
{
    auto lf_CopyVersionChar = [](const std::string version, std::vector<char> &buffer,
                                 size_t &position) {
        helper::CopyToBuffer(buffer, position, version.c_str());
    };

    auto &buffer = b.m_Buffer;
    auto &position = b.m_Position;
    auto &absolutePosition = b.m_AbsolutePosition;
    if (position > 0)
    {
        helper::Throw<std::invalid_argument>("Toolkit", "format::bp::BP4Serializer", "MakeHeader",
                                             "can only be called for an empty "
                                             "buffer. This one for " +
                                                 fileType + " already has content of " +
                                                 std::to_string(position) + " bytes.");
    }

    if (b.GetAvailableSize() < 64)
    {
        b.Resize(position + 64, "BP4Serializer::MakeHeader " + fileType);
    }

    const std::string majorVersion(std::to_string(ADIOS2_VERSION_MAJOR));
    const char minorVersionChar = '0' + ADIOS2_VERSION_MINOR;
    const std::string minorVersion(1, minorVersionChar);
    const std::string patchVersion(std::to_string(ADIOS2_VERSION_PATCH));

    // byte 0-31: Readable tag
    if (position != m_VersionTagPosition)
    {
        helper::Throw<std::runtime_error>("Toolkit", "format::bp::BP4Serializer", "MakeHeader",
                                          "Version Tag "
                                          "position mismatch");
    }
    std::string versionLongTag("ADIOS-BP v" + majorVersion + "." + minorVersion + "." +
                               patchVersion + " ");
    size_t maxTypeLen = m_VersionTagLength - versionLongTag.size();
    const std::string fileTypeStr = fileType.substr(0, maxTypeLen);
    versionLongTag += fileTypeStr;
    const size_t versionLongTagSize = versionLongTag.size();
    if (versionLongTagSize < m_VersionTagLength)
    {
        helper::CopyToBuffer(buffer, position, versionLongTag.c_str(), versionLongTagSize);
        position += m_VersionTagLength - versionLongTagSize;
    }
    else if (versionLongTagSize > m_VersionTagLength)
    {
        helper::CopyToBuffer(buffer, position, versionLongTag.c_str(), m_VersionTagLength);
    }
    else
    {
        helper::CopyToBuffer(buffer, position, versionLongTag.c_str(), m_VersionTagLength);
    }

    // byte 32-35: MAJOR MINOR PATCH Unused

    lf_CopyVersionChar(majorVersion, buffer, position);
    lf_CopyVersionChar(minorVersion, buffer, position);
    lf_CopyVersionChar(patchVersion, buffer, position);
    ++position;

    // Note: Reader does process and use bytes 36-38 in
    // BP4Deserialize.cpp::ParseMetadataIndex().
    // Order and position must match there.

    // byte 36: endianness
    if (position != m_EndianFlagPosition)
    {
        helper::Throw<std::runtime_error>("Toolkit", "format::bp::BP4Serializer", "MakeHeader",
                                          "Endian Flag "
                                          "position mismatch");
    }
    const uint8_t endianness = helper::IsLittleEndian() ? 0 : 1;
    helper::CopyToBuffer(buffer, position, &endianness);

    // byte 37: BP Version 4
    if (position != m_BPVersionPosition)
    {
        helper::Throw<std::runtime_error>("Toolkit", "format::bp::BP4Serializer", "MakeHeader",
                                          "Active Flag "
                                          "position mismatch");
    }
    const uint8_t version = 4;
    helper::CopyToBuffer(buffer, position, &version);

    // byte 38: Active flag (used in Index Table only)
    if (position != m_ActiveFlagPosition)
    {
        helper::Throw<std::runtime_error>("Toolkit", "format::bp::BP4Serializer", "MakeHeader",
                                          "Active Flag "
                                          "position mismatch");
    }
    const uint8_t activeFlag = (isActive ? 1 : 0);
    helper::CopyToBuffer(buffer, position, &activeFlag);

    // byte 39: unused
    position += 1;

    // byte 40-63: unused
    position += 24;
    absolutePosition = position;
}